

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5HighlightCb(void *pContext,int tflags,char *pToken,int nToken,int iStartOff,int iEndOff)

{
  int iVar1;
  int local_44;
  int iPos;
  int rc;
  HighlightContext *p;
  int local_30;
  int iEndOff_local;
  int iStartOff_local;
  int nToken_local;
  char *pToken_local;
  void *pvStack_18;
  int tflags_local;
  void *pContext_local;
  
  local_44 = 0;
  if ((tflags & 1U) == 0) {
    iVar1 = *(int *)((long)pContext + 0x28);
    *(int *)((long)pContext + 0x28) = iVar1 + 1;
    if (0 < *(int *)((long)pContext + 0x30)) {
      if ((iVar1 < *(int *)((long)pContext + 0x2c)) || (*(int *)((long)pContext + 0x30) < iVar1)) {
        return 0;
      }
      if ((*(int *)((long)pContext + 0x2c) != 0) && (iVar1 == *(int *)((long)pContext + 0x2c))) {
        *(int *)((long)pContext + 0x54) = iStartOff;
      }
    }
    _iPos = (HighlightContext *)pContext;
    p._4_4_ = iEndOff;
    local_30 = iStartOff;
    iEndOff_local = nToken;
    _iStartOff_local = pToken;
    pToken_local._4_4_ = tflags;
    pvStack_18 = pContext;
    if (iVar1 == *(int *)((long)pContext + 0x1c)) {
      fts5HighlightAppend(&local_44,(HighlightContext *)pContext,
                          (char *)(*(long *)((long)pContext + 0x48) +
                                  (long)*(int *)((long)pContext + 0x54)),
                          iStartOff - *(int *)((long)pContext + 0x54));
      fts5HighlightAppend(&local_44,_iPos,_iPos->zOpen,-1);
      _iPos->iOff = local_30;
    }
    if (iVar1 == (_iPos->iter).iEnd) {
      if ((_iPos->iRangeEnd != 0) && ((_iPos->iter).iStart < _iPos->iRangeStart)) {
        fts5HighlightAppend(&local_44,_iPos,_iPos->zOpen,-1);
      }
      fts5HighlightAppend(&local_44,_iPos,_iPos->zIn + _iPos->iOff,p._4_4_ - _iPos->iOff);
      fts5HighlightAppend(&local_44,_iPos,_iPos->zClose,-1);
      _iPos->iOff = p._4_4_;
      if (local_44 == 0) {
        local_44 = fts5CInstIterNext(&_iPos->iter);
      }
    }
    if ((0 < _iPos->iRangeEnd) && (iVar1 == _iPos->iRangeEnd)) {
      fts5HighlightAppend(&local_44,_iPos,_iPos->zIn + _iPos->iOff,p._4_4_ - _iPos->iOff);
      _iPos->iOff = p._4_4_;
      if (((_iPos->iter).iStart <= iVar1) && (iVar1 < (_iPos->iter).iEnd)) {
        fts5HighlightAppend(&local_44,_iPos,_iPos->zClose,-1);
      }
    }
    pContext_local._4_4_ = local_44;
  }
  else {
    pContext_local._4_4_ = 0;
  }
  return pContext_local._4_4_;
}

Assistant:

static int fts5HighlightCb(
  void *pContext,                 /* Pointer to HighlightContext object */
  int tflags,                     /* Mask of FTS5_TOKEN_* flags */
  const char *pToken,             /* Buffer containing token */
  int nToken,                     /* Size of token in bytes */
  int iStartOff,                  /* Start offset of token */
  int iEndOff                     /* End offset of token */
){
  HighlightContext *p = (HighlightContext*)pContext;
  int rc = SQLITE_OK;
  int iPos;

  UNUSED_PARAM2(pToken, nToken);

  if( tflags & FTS5_TOKEN_COLOCATED ) return SQLITE_OK;
  iPos = p->iPos++;

  if( p->iRangeEnd>0 ){
    if( iPos<p->iRangeStart || iPos>p->iRangeEnd ) return SQLITE_OK;
    if( p->iRangeStart && iPos==p->iRangeStart ) p->iOff = iStartOff;
  }

  if( iPos==p->iter.iStart ){
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iStartOff - p->iOff);
    fts5HighlightAppend(&rc, p, p->zOpen, -1);
    p->iOff = iStartOff;
  }

  if( iPos==p->iter.iEnd ){
    if( p->iRangeEnd && p->iter.iStart<p->iRangeStart ){
      fts5HighlightAppend(&rc, p, p->zOpen, -1);
    }
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iEndOff - p->iOff);
    fts5HighlightAppend(&rc, p, p->zClose, -1);
    p->iOff = iEndOff;
    if( rc==SQLITE_OK ){
      rc = fts5CInstIterNext(&p->iter);
    }
  }

  if( p->iRangeEnd>0 && iPos==p->iRangeEnd ){
    fts5HighlightAppend(&rc, p, &p->zIn[p->iOff], iEndOff - p->iOff);
    p->iOff = iEndOff;
    if( iPos>=p->iter.iStart && iPos<p->iter.iEnd ){
      fts5HighlightAppend(&rc, p, p->zClose, -1);
    }
  }

  return rc;
}